

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::from_powxn
          (ChebyshevExpansion *__return_storage_ptr__,size_t n,double xmin,double xmax)

{
  Scalar SVar1;
  invalid_argument *piVar2;
  Scalar *pSVar3;
  double value;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChebyshevExpansion local_b8;
  Scalar local_78;
  double coeff;
  size_t index;
  size_t k;
  undefined1 local_48 [8];
  VectorXd c;
  double xmax_local;
  double xmin_local;
  size_t n_local;
  
  if ((xmin != -1.0) || (NAN(xmin))) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"xmin must be -1");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((xmax == 1.0) && (!NAN(xmax))) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&k,n + 1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_48,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&k);
    for (index = 0; xmin_local._0_4_ = (int)n, index <= n >> 1; index = index + 1) {
      coeff = (double)(n + index * -2);
      auVar4._8_4_ = (int)(n >> 0x20);
      auVar4._0_8_ = n;
      auVar4._12_4_ = 0x45300000;
      auVar5._8_4_ = (int)(index >> 0x20);
      auVar5._0_8_ = index;
      auVar5._12_4_ = 0x45300000;
      local_78 = binomialCoefficient((auVar4._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,xmin_local._0_4_) -
                                     4503599627370496.0),
                                     (auVar5._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)index) - 4503599627370496.0))
      ;
      if (coeff == 0.0) {
        local_78 = local_78 / 2.0;
      }
      SVar1 = local_78;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_48,
                          (Index)coeff);
      *pSVar3 = SVar1;
    }
    value = pow(2.0,(double)(1 - xmin_local._0_4_));
    ChebyshevExpansion(&local_b8,(vectype *)local_48,xmin,xmax);
    ChebTools::operator*(__return_storage_ptr__,value,&local_b8);
    ~ChebyshevExpansion(&local_b8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_48);
    return __return_storage_ptr__;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"xmax must be 1");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::from_powxn(const std::size_t n, const double xmin, const double xmax) {
        if (xmin != -1) {
            throw std::invalid_argument("xmin must be -1");
        }
        if (xmax != 1) {
            throw std::invalid_argument("xmax must be 1");
        }
        Eigen::VectorXd c = Eigen::VectorXd::Zero(n + 1);
        for (std::size_t k = 0; k <= n / 2; ++k) {
            std::size_t index = n - 2 * k;
            double coeff = binomialCoefficient(static_cast<double>(n), static_cast<double>(k));
            if (index == 0) {
                coeff /= 2.0;
            }
            c(index) = coeff;
        }
        return pow(2, 1-static_cast<int>(n))*ChebyshevExpansion(c, xmin, xmax);
    }